

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O0

bool __thiscall
test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>::do_test
          (test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *this,size_t rounds)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  void *pvVar5;
  bool local_89;
  bool local_79;
  bool local_69;
  bool local_59;
  bool local_49;
  bool local_31;
  ulong local_28;
  size_t i;
  bool result_is_ok;
  size_t rounds_local;
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *this_local;
  
  i._7_1_ = true;
  for (local_28 = 0; local_28 < rounds; local_28 = local_28 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "initialize()       boost compare with uintwide_t: round ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,",  digits2: ");
    uVar3 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[3])();
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "test_binary_add()  boost compare with uintwide_t: round ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,",  digits2: ");
    uVar3 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    bVar1 = test_binary_add(this);
    local_31 = false;
    if (bVar1) {
      local_31 = i._7_1_;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "test_binary_sub()  boost compare with uintwide_t: round ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,",  digits2: ");
    uVar3 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    bVar2 = test_binary_sub(this);
    local_49 = false;
    bVar1 = local_31;
    if (!bVar2) {
      bVar1 = local_49;
    }
    local_49 = bVar1;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "test_binary_mul()  boost compare with uintwide_t: round ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,",  digits2: ");
    uVar3 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    bVar2 = test_binary_mul(this);
    local_59 = false;
    bVar1 = local_49;
    if (!bVar2) {
      bVar1 = local_59;
    }
    local_59 = bVar1;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "test_binary_div()  boost compare with uintwide_t: round ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,",  digits2: ");
    uVar3 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    bVar2 = test_binary_div(this);
    local_69 = false;
    bVar1 = local_59;
    if (!bVar2) {
      bVar1 = local_69;
    }
    local_69 = bVar1;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "test_binary_mod()  boost compare with uintwide_t: round ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,",  digits2: ");
    uVar3 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    bVar2 = test_binary_mod(this);
    local_79 = false;
    bVar1 = local_69;
    if (!bVar2) {
      bVar1 = local_79;
    }
    local_79 = bVar1;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "test_binary_sqrt() boost compare with uintwide_t: round ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,",  digits2: ");
    uVar3 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    bVar2 = test_binary_sqrt(this);
    local_89 = false;
    bVar1 = local_79;
    if (!bVar2) {
      bVar1 = local_89;
    }
    local_89 = bVar1;
    i._7_1_ = local_89;
  }
  return i._7_1_;
}

Assistant:

auto do_test(std::size_t rounds) -> bool override
    {
      bool result_is_ok = true;

      for(std::size_t i = 0U; i < rounds; ++i)
      {
        std::cout << "initialize()       boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        this->initialize();

        std::cout << "test_binary_add()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_add() && result_is_ok);

        std::cout << "test_binary_sub()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_sub() && result_is_ok);

        std::cout << "test_binary_mul()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mul() && result_is_ok);

        std::cout << "test_binary_div()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_div() && result_is_ok);

        std::cout << "test_binary_mod()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mod() && result_is_ok);

        std::cout << "test_binary_sqrt() boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_sqrt() && result_is_ok);
      }

      return result_is_ok;
    }